

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalNinjaGenerator::ninjaVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  long *plVar1;
  long *plVar2;
  string command;
  long *local_60;
  long local_50;
  long lStack_48;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ninjaCmd_abi_cxx11_(&local_40,this);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::RunSingleCommand
            ((char *)local_60,__return_storage_ptr__,(string *)0x0,(int *)0x0,(char *)0x0,
             OUTPUT_NONE,0.0);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaVersion() const
{
  std::string version;
  std::string command = ninjaCmd() + " --version";
  cmSystemTools::RunSingleCommand(command.c_str(),
                                  &version, 0, 0, 0,
                                  cmSystemTools::OUTPUT_NONE);

  return version;
}